

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O0

uint32_t * light_pcapng_to_memory(light_pcapng pcapng,size_t *size)

{
  uint uVar1;
  _light_option *option;
  uint32_t *__src;
  size_t __n;
  long *in_RSI;
  light_pcapng in_RDI;
  int y_ret;
  int x_ret_1;
  uint32_t *option_mem;
  size_t option_length;
  size_t body_length;
  void *x_ret;
  uint32_t *block_offset;
  uint32_t *block_mem;
  size_t bytes;
  light_pcapng iterator;
  size_t *in_stack_ffffffffffffffb0;
  uint32_t *local_38;
  size_t local_28;
  light_pcapng local_20;
  uint32_t *local_8;
  
  if (in_RDI == (light_pcapng)0x0) {
    *in_RSI = 0;
    local_8 = (uint32_t *)0x0;
  }
  else {
    local_28 = light_get_size(in_RDI);
    local_8 = (uint32_t *)calloc(local_28,1);
    if (local_8 == (uint32_t *)0x0) {
      fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
              ,"light_pcapng_to_memory",0x15a);
      local_8 = (uint32_t *)0x0;
    }
    else {
      *in_RSI = 0;
      local_38 = local_8;
      for (local_20 = in_RDI; local_20 != (light_pcapng)0x0 && local_28 != 0;
          local_20 = local_20->next_block) {
        option = (_light_option *)((ulong)local_20->block_total_lenght - 0xc);
        __src = __get_option_size(option,in_stack_ffffffffffffffb0);
        __n = (long)option - (long)in_stack_ffffffffffffffb0;
        *local_38 = local_20->block_type;
        local_38[1] = local_20->block_total_lenght;
        memcpy(local_38 + 2,local_20->block_body,__n);
        memcpy(local_38 + (__n >> 2) + 2,__src,(size_t)in_stack_ffffffffffffffb0);
        local_38[(local_20->block_total_lenght >> 2) - 1] = local_20->block_total_lenght;
        uVar1 = (int)__n + (int)in_stack_ffffffffffffffb0 + 0xc;
        if (local_20->block_total_lenght != uVar1) {
          fprintf(_stderr,"ERROR at %s::%s::%d: %d != %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
                  ,"light_pcapng_to_memory",0x169,(ulong)local_20->block_total_lenght,uVar1);
        }
        local_38 = local_38 + (local_20->block_total_lenght >> 2);
        local_28 = local_28 - local_20->block_total_lenght;
        *in_RSI = (ulong)local_20->block_total_lenght + *in_RSI;
        free(__src);
      }
    }
  }
  return local_8;
}

Assistant:

uint32_t *light_pcapng_to_memory(const light_pcapng pcapng, size_t *size)
{
	if (pcapng == NULL) {
		*size = 0;
		return NULL;
	}

	light_pcapng iterator = pcapng;
	size_t bytes = light_get_size(pcapng);
	uint32_t *block_mem = calloc(bytes, 1);
	uint32_t *block_offset = block_mem;
	DCHECK_NULLP(block_offset, return NULL);

	*size = 0;
	while (iterator != NULL && bytes > 0) {
		size_t body_length = iterator->block_total_lenght - 2 * sizeof(iterator->block_total_lenght) - sizeof(iterator->block_type);
		size_t option_length;
		uint32_t *option_mem = __get_option_size(iterator->options, &option_length);
		body_length -= option_length;

		block_offset[0] = iterator->block_type;
		block_offset[1] = iterator->block_total_lenght;
		memcpy(&block_offset[2], iterator->block_body, body_length);
		memcpy(&block_offset[2 + body_length / 4], option_mem, option_length);
		block_offset[iterator->block_total_lenght / 4 - 1] = iterator->block_total_lenght;

		DCHECK_ASSERT(iterator->block_total_lenght, body_length + option_length + 3 * sizeof(uint32_t), light_stop);
		block_offset += iterator->block_total_lenght / 4;
		bytes -= iterator->block_total_lenght;
		*size += iterator->block_total_lenght;

		free(option_mem);
		iterator = iterator->next_block;
	}

	return block_mem;
}